

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O0

void __thiscall Pl_RunLength::encode(Pl_RunLength *this,uchar *data,size_t len)

{
  uchar uVar1;
  state_e sVar2;
  pointer pMVar3;
  logic_error *this_00;
  pointer pMVar4;
  uchar ch;
  ulong local_28;
  size_t i;
  size_t len_local;
  uchar *data_local;
  Pl_RunLength *this_local;
  
  local_28 = 0;
  do {
    if (len <= local_28) {
      return;
    }
    pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    sVar2 = pMVar3->state;
    pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    if ((sVar2 == st_top) != pMVar3->length < 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Pl_RunLength::encode: state/length inconsistency");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    uVar1 = data[local_28];
    pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    if ((pMVar3->length == 0) ||
       ((pMVar3 = std::
                  unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
                  operator->(&this->m), pMVar3->state != st_copying &&
        (pMVar3 = std::
                  unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
                  operator->(&this->m), 0x7f < pMVar3->length)))) {
LAB_00156af5:
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      if ((pMVar3->length == 0x80) ||
         (pMVar3 = std::
                   unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
                   operator->(&this->m), pMVar3->state == st_run)) {
        flush_encode(this);
      }
      else {
        pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        if (pMVar3->length != 0) {
          pMVar3 = std::
                   unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
                   operator->(&this->m);
          pMVar3->state = st_copying;
        }
      }
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar4 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar3->buf[pMVar4->length] = uVar1;
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar3->length = pMVar3->length + 1;
    }
    else {
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar4 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      if (uVar1 != pMVar3->buf[pMVar4->length - 1]) goto LAB_00156af5;
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      QTC::TC("libtests","Pl_RunLength: switch to run",(uint)(pMVar3->length != 0x80));
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      if (pMVar3->state == st_copying) {
        pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar3->length = pMVar3->length - 1;
        flush_encode(this);
        pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar3->buf[0] = uVar1;
        pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar3->length = 1;
      }
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar3->state = st_run;
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar4 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar3->buf[pMVar4->length] = uVar1;
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar3->length = pMVar3->length + 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void
Pl_RunLength::encode(unsigned char const* data, size_t len)
{
    for (size_t i = 0; i < len; ++i) {
        if ((m->state == st_top) != (m->length <= 1)) {
            throw std::logic_error("Pl_RunLength::encode: state/length inconsistency");
        }
        unsigned char ch = data[i];
        if ((m->length > 0) && ((m->state == st_copying) || (m->length < 128)) &&
            (ch == m->buf[m->length - 1])) {
            QTC::TC("libtests", "Pl_RunLength: switch to run", (m->length == 128) ? 0 : 1);
            if (m->state == st_copying) {
                --m->length;
                flush_encode();
                m->buf[0] = ch;
                m->length = 1;
            }
            m->state = st_run;
            m->buf[m->length] = ch;
            ++m->length;
        } else {
            if ((m->length == 128) || (m->state == st_run)) {
                flush_encode();
            } else if (m->length > 0) {
                m->state = st_copying;
            }
            m->buf[m->length] = ch;
            ++m->length;
        }
    }
}